

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_flow_stmt(gvisitor_t *self,gnode_flow_stmt_t *node)

{
  gtoken_t gVar1;
  long lVar2;
  long lVar3;
  _Bool _Var4;
  void *pvVar5;
  long local_28;
  gtoken_t type;
  gnode_flow_stmt_t *node_local;
  gvisitor_t *self_local;
  
  _Var4 = is_expression_assignment(node->cond);
  if (_Var4) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,node->cond,"Assignment not allowed here");
  }
  gVar1 = (node->base).token.type;
  if (gVar1 == TOK_KEY_IF) {
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    if (node->elsestmt != (gnode_t *)0x0) {
      gvisit(self,node->elsestmt);
    }
  }
  else if (gVar1 == TOK_KEY_SWITCH) {
    if (*(long *)((long)self->data + 8) == *(long *)((long)self->data + 0x10)) {
      if (*(long *)((long)self->data + 0x10) == 0) {
        local_28 = 8;
      }
      else {
        local_28 = *(long *)((long)self->data + 0x10) << 1;
      }
      *(long *)((long)self->data + 0x10) = local_28;
      pvVar5 = realloc(*(void **)((long)self->data + 0x18),*(long *)((long)self->data + 0x10) << 1);
      *(void **)((long)self->data + 0x18) = pvVar5;
    }
    lVar2 = *(long *)((long)self->data + 0x18);
    lVar3 = *(long *)((long)self->data + 8);
    *(long *)((long)self->data + 8) = lVar3 + 1;
    *(undefined2 *)(lVar2 + lVar3 * 2) = 0xf;
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    *(long *)((long)self->data + 8) = *(long *)((long)self->data + 8) + -1;
  }
  else if (gVar1 == TOK_OP_TERNARY) {
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    gvisit(self,node->elsestmt);
  }
  return;
}

Assistant:

static void visit_flow_stmt (gvisitor_t *self, gnode_flow_stmt_t *node) {
    DEBUG_CODEGEN("visit_flow_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH) || (type == TOK_OP_TERNARY));

    if (type == TOK_KEY_IF) {
        visit_flow_if_stmt(self, node);
    } else if (type == TOK_KEY_SWITCH) {
        visit_flow_switch_stmt(self, node);
    } else if (type == TOK_OP_TERNARY) {
        visit_flow_ternary_stmt(self, node);
    }
}